

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMorton::
build<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::TriangleMv<4>>,embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>
          (BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,BVHBuilderMorton *this,
          BVH *createAllocator,TriangleMesh *param_4,BuildProgressMonitorInterface *param_5,
          BuildPrim *param_6)

{
  Builder builder;
  Create local_91;
  CalculateMeshBounds<embree::TriangleMesh> local_90;
  SetBVHNBounds<4> local_88;
  CreateAlloc local_80;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
  local_78;
  
  local_78.createAllocator = &local_80;
  local_78.setBounds = &local_88;
  local_78.calculateBounds = &local_90;
  local_78.super_Settings.singleThreadThreshold =
       *(size_t *)(builder.super_Settings.minLeafSize + 0x20);
  local_78.super_Settings.branchingFactor = *(size_t *)builder.super_Settings.minLeafSize;
  local_78.super_Settings.maxDepth = *(size_t *)(builder.super_Settings.minLeafSize + 8);
  local_78.super_Settings.minLeafSize = *(size_t *)(builder.super_Settings.minLeafSize + 0x10);
  local_78.super_Settings.maxLeafSize = *(size_t *)(builder.super_Settings.minLeafSize + 0x18);
  local_78.createNode = &local_91;
  local_78.createLeaf = (CreateMortonLeaf<4,_embree::TriangleMv<4>_> *)&stack0x00000008;
  local_78.morton = (BuildPrim *)0x0;
  local_90.mesh = param_4;
  local_88.bvh = createAllocator;
  local_80.super_Create.allocator = (Create)(Create)this;
  local_78.progressMonitor = param_5;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
  ::build(__return_storage_ptr__,&local_78,param_6,
          (BuildPrim *)builder.super_Settings.branchingFactor,builder.super_Settings.maxDepth);
  return __return_storage_ptr__;
}

Assistant:

static ReductionTy build(CreateAllocFunc createAllocator,
                                 CreateNodeFunc createNode,
                                 SetBoundsFunc setBounds,
                                 CreateLeafFunc createLeaf,
                                 CalculateBoundsFunc calculateBounds,
                                 ProgressMonitor progressMonitor,
                                 BuildPrim* src,
                                 BuildPrim* tmp,
                                 size_t numPrimitives,
                                 const Settings& settings)
        {
          typedef BuilderT<
            ReductionTy,
            decltype(createAllocator()),
            CreateAllocFunc,
            CreateNodeFunc,
            SetBoundsFunc,
            CreateLeafFunc,
            CalculateBoundsFunc,
            ProgressMonitor> Builder;

          Builder builder(createAllocator,
                          createNode,
                          setBounds,
                          createLeaf,
                          calculateBounds,
                          progressMonitor,
                          settings);

          return builder.build(src,tmp,numPrimitives);
        }